

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O0

int stbi__getn(stbi__context *s,stbi_uc *buffer,int n)

{
  int iVar1;
  int iVar2;
  int count;
  int res;
  int blen;
  int n_local;
  stbi_uc *buffer_local;
  stbi__context *s_local;
  
  if (((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) ||
     (iVar1 = (int)s->img_buffer_end - (int)s->img_buffer, n <= iVar1)) {
    if (s->img_buffer_end < s->img_buffer + n) {
      s_local._4_4_ = 0;
    }
    else {
      memcpy(buffer,s->img_buffer,(long)n);
      s->img_buffer = s->img_buffer + n;
      s_local._4_4_ = 1;
    }
  }
  else {
    memcpy(buffer,s->img_buffer,(long)iVar1);
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)(buffer + iVar1),n - iVar1);
    s_local._4_4_ = (uint)(iVar2 == n - iVar1);
    s->img_buffer = s->img_buffer_end;
  }
  return s_local._4_4_;
}

Assistant:

static int stbi__getn(stbi__context *s, stbi_uc *buffer, int n)
{
   if (s->io.read) {
      int blen = (int) (s->img_buffer_end - s->img_buffer);
      if (blen < n) {
         int res, count;

         memcpy(buffer, s->img_buffer, blen);

         count = (s->io.read)(s->io_user_data, (char*) buffer + blen, n - blen);
         res = (count == (n-blen));
         s->img_buffer = s->img_buffer_end;
         return res;
      }
   }

   if (s->img_buffer+n <= s->img_buffer_end) {
      memcpy(buffer, s->img_buffer, n);
      s->img_buffer += n;
      return 1;
   } else
      return 0;
}